

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,CharClass<wchar_t> *cc)

{
  CharClass<wchar_t> *pCVar1;
  CharClass<wchar_t> local_38;
  CharClass<wchar_t> *local_18;
  CharClass<wchar_t> *cc_local;
  CharClass<wchar_t> *this_local;
  
  local_18 = cc;
  cc_local = this;
  operator|(&local_38,this,cc);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const CharClass<TCHAR>& cc)
    {
        return *this = *this | cc;
    }